

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gpnp5::sPolynomial37
               (Matrix<double,_44,_80,_0,_44,_80> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
          m_storage.m_data.array[0x772];
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
          m_storage.m_data.array[0xbd0];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x8bd] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x8a6] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbfc] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x8e9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x8d2] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc28] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x915] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x8fe] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc54] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x941] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x92a] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc80] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x96d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x956] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x999] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x982] / dVar1;
  dVar3 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).
          m_storage.m_data.array[0x9da];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x9c5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0x9ae] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0x9f1] =
       dVar3 / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcac] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xa1d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xa06] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xb51] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb3a] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcd8] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xb7d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb66] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd04] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xba9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xb92] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd30] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xbd5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbbe] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd5c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xc01] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xbea] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xc2d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc16] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xc59] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc42] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xc85] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc6e] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd88] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xcb1] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xc9a] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xcdd] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcc6] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xd09] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xcf2] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xd35] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd1e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xd61] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd4a] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xdb4] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xd8d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xd76] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
  m_data.array[0xdb9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_44,_80,_0,_44,_80>_>).m_storage.
       m_data.array[0xda2] / dVar1;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp5::sPolynomial37( Eigen::Matrix<double,44,80> & groebnerMatrix )
{
  groebnerMatrix(37,50) = (groebnerMatrix(14,50)/(groebnerMatrix(14,43))-groebnerMatrix(32,69)/(groebnerMatrix(32,68)));
  groebnerMatrix(37,51) = (groebnerMatrix(14,51)/(groebnerMatrix(14,43))-groebnerMatrix(32,70)/(groebnerMatrix(32,68)));
  groebnerMatrix(37,52) = (groebnerMatrix(14,52)/(groebnerMatrix(14,43))-groebnerMatrix(32,71)/(groebnerMatrix(32,68)));
  groebnerMatrix(37,53) = (groebnerMatrix(14,53)/(groebnerMatrix(14,43))-groebnerMatrix(32,72)/(groebnerMatrix(32,68)));
  groebnerMatrix(37,54) = groebnerMatrix(14,54)/(groebnerMatrix(14,43));
  groebnerMatrix(37,55) = groebnerMatrix(14,55)/(groebnerMatrix(14,43));
  groebnerMatrix(37,56) = groebnerMatrix(14,56)/(groebnerMatrix(14,43));
  groebnerMatrix(37,57) = (groebnerMatrix(14,57)/(groebnerMatrix(14,43))-groebnerMatrix(32,73)/(groebnerMatrix(32,68)));
  groebnerMatrix(37,58) = groebnerMatrix(14,58)/(groebnerMatrix(14,43));
  groebnerMatrix(37,65) = (groebnerMatrix(14,65)/(groebnerMatrix(14,43))-groebnerMatrix(32,74)/(groebnerMatrix(32,68)));
  groebnerMatrix(37,66) = (groebnerMatrix(14,66)/(groebnerMatrix(14,43))-groebnerMatrix(32,75)/(groebnerMatrix(32,68)));
  groebnerMatrix(37,67) = (groebnerMatrix(14,67)/(groebnerMatrix(14,43))-groebnerMatrix(32,76)/(groebnerMatrix(32,68)));
  groebnerMatrix(37,68) = (groebnerMatrix(14,68)/(groebnerMatrix(14,43))-groebnerMatrix(32,77)/(groebnerMatrix(32,68)));
  groebnerMatrix(37,69) = groebnerMatrix(14,69)/(groebnerMatrix(14,43));
  groebnerMatrix(37,70) = groebnerMatrix(14,70)/(groebnerMatrix(14,43));
  groebnerMatrix(37,71) = groebnerMatrix(14,71)/(groebnerMatrix(14,43));
  groebnerMatrix(37,72) = (groebnerMatrix(14,72)/(groebnerMatrix(14,43))-groebnerMatrix(32,78)/(groebnerMatrix(32,68)));
  groebnerMatrix(37,73) = groebnerMatrix(14,73)/(groebnerMatrix(14,43));
  groebnerMatrix(37,74) = groebnerMatrix(14,74)/(groebnerMatrix(14,43));
  groebnerMatrix(37,75) = groebnerMatrix(14,75)/(groebnerMatrix(14,43));
  groebnerMatrix(37,76) = groebnerMatrix(14,76)/(groebnerMatrix(14,43));
  groebnerMatrix(37,77) = (groebnerMatrix(14,77)/(groebnerMatrix(14,43))-groebnerMatrix(32,79)/(groebnerMatrix(32,68)));
  groebnerMatrix(37,78) = groebnerMatrix(14,78)/(groebnerMatrix(14,43));
  groebnerMatrix(37,79) = groebnerMatrix(14,79)/(groebnerMatrix(14,43));
}